

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

void RightAlignedText(char *t,int w)

{
  ImVec2 IVar1;
  ImVec2 s;
  ImVec2 local_18;
  
  IVar1 = ImGui::CalcTextSize(t,(char *)0x0,false,-1.0);
  local_18.x = IVar1.x;
  local_18.y = IVar1.y;
  local_18.x = (float)w - local_18.x;
  ImGui::Dummy(&local_18);
  ImGui::SameLine(0.0,-1.0);
  ImGui::Text("%s",t);
  return;
}

Assistant:

void RightAlignedText(const char *t, int w) {
	ImVec2 s = ImGui::CalcTextSize(t);
	s.x      = w - s.x;
	ImGui::Dummy(s);
	ImGui::SameLine();
	ImGui::Text("%s", t);
}